

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O0

void av1_restore_sb_state
               (SB_FIRST_PASS_STATS *sb_fp_stats,AV1_COMP *cpi,ThreadData_conflict *td,
               TileDataEnc *tile_data,int mi_row,int mi_col)

{
  int iVar1;
  long in_RCX;
  RD_SEARCH_MACROBLOCK_CONTEXT *in_RDX;
  MACROBLOCK *in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int alloc_mi_idx;
  BLOCK_SIZE sb_size;
  int num_planes;
  AV1_COMMON *cm;
  MACROBLOCK *x;
  RD_SEARCH_MACROBLOCK_CONTEXT *ctx;
  MACROBLOCK *x_00;
  
  ctx = in_RDX;
  x_00 = in_RSI;
  av1_num_planes((AV1_COMMON *)(in_RSI[1].picked_ref_frames_mask + 0x1b4));
  av1_restore_context(x_00,ctx,(int)((ulong)in_RCX >> 0x20),(int)in_RCX,
                      (BLOCK_SIZE)((uint)in_R8D >> 0x18),in_R9D);
  memcpy(ctx[0x1c8].a + 0x40,(void *)(in_RDI + 0x150),0x598);
  *(undefined4 *)(in_RDX[0x1c7].sl + 8) = *(undefined4 *)(in_RDI + 0x6e8);
  memcpy(*(void **)(ctx[0x1cc].l + 0x38),(void *)(in_RDI + 0x6ec),0xc0);
  if (x_00[2].sb_enc.tpl_mv[0x3d][4].as_int == 1) {
    memcpy((void *)(in_RCX + 0x5338),(void *)(in_RDI + 0x7b0),0x9a0);
  }
  memcpy((void *)((long)&in_RDX[0x12d].p_ta + 4),(void *)(in_RDI + 0x1150),0x3a18);
  iVar1 = get_alloc_mi_idx((CommonModeInfoParams *)(in_RSI[1].picked_ref_frames_mask + 0x236),in_R8D
                           ,in_R9D);
  *(undefined4 *)(*(long *)(in_RSI[1].picked_ref_frames_mask + 0x23c) + (long)iVar1 * 0xb0 + 4) =
       *(undefined4 *)(in_RDI + 0x4b68);
  return;
}

Assistant:

void av1_restore_sb_state(const SB_FIRST_PASS_STATS *sb_fp_stats, AV1_COMP *cpi,
                          ThreadData *td, TileDataEnc *tile_data, int mi_row,
                          int mi_col) {
  MACROBLOCK *x = &td->mb;

  const AV1_COMMON *cm = &cpi->common;
  const int num_planes = av1_num_planes(cm);
  const BLOCK_SIZE sb_size = cm->seq_params->sb_size;

  av1_restore_context(x, &sb_fp_stats->x_ctx, mi_row, mi_col, sb_size,
                      num_planes);

  td->rd_counts = sb_fp_stats->rd_count;
  x->txfm_search_info.txb_split_count = sb_fp_stats->split_count;

  *td->counts = sb_fp_stats->fc;

  if (cpi->sf.inter_sf.inter_mode_rd_model_estimation == 1) {
    memcpy(tile_data->inter_mode_rd_models, sb_fp_stats->inter_mode_rd_models,
           sizeof(sb_fp_stats->inter_mode_rd_models));
  }

  memcpy(x->thresh_freq_fact, sb_fp_stats->thresh_freq_fact,
         sizeof(sb_fp_stats->thresh_freq_fact));

  const int alloc_mi_idx = get_alloc_mi_idx(&cm->mi_params, mi_row, mi_col);
  cm->mi_params.mi_alloc[alloc_mi_idx].current_qindex =
      sb_fp_stats->current_qindex;

#if CONFIG_INTERNAL_STATS
  memcpy(cpi->mode_chosen_counts, sb_fp_stats->mode_chosen_counts,
         sizeof(sb_fp_stats->mode_chosen_counts));
#endif  // CONFIG_INTERNAL_STATS
}